

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O0

size_t __thiscall
llvm::cl::opt<bool,_false,_llvm::cl::parser<bool>_>::getOptionWidth
          (opt<bool,_false,_llvm::cl::parser<bool>_> *this)

{
  size_t sVar1;
  opt<bool,_false,_llvm::cl::parser<bool>_> *this_local;
  
  sVar1 = basic_parser_impl::getOptionWidth((basic_parser_impl *)&this->Parser,&this->super_Option);
  return sVar1;
}

Assistant:

size_t getOptionWidth() const override {
    return Parser.getOptionWidth(*this);
  }